

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

bool caffe::NetNeedsDataUpgrade(NetParameter *net_param)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  V1LayerParameter_LayerType VVar4;
  V1LayerParameter *pVVar5;
  DataParameter *from;
  ImageDataParameter *from_00;
  WindowDataParameter *from_01;
  undefined1 local_120 [8];
  WindowDataParameter layer_param_2;
  ImageDataParameter layer_param_1;
  undefined1 local_68 [8];
  DataParameter layer_param;
  int i;
  NetParameter *net_param_local;
  
  for (layer_param._68_4_ = 0; uVar1 = layer_param._68_4_,
      iVar3 = NetParameter::layers_size(net_param), (int)uVar1 < iVar3;
      layer_param._68_4_ = layer_param._68_4_ + 1) {
    pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
    VVar4 = V1LayerParameter::type(pVVar5);
    if (VVar4 == V1LayerParameter_LayerType_DATA) {
      pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
      from = V1LayerParameter::data_param(pVVar5);
      DataParameter::DataParameter((DataParameter *)local_68,from);
      bVar2 = DataParameter::has_scale((DataParameter *)local_68);
      if (bVar2) {
        net_param_local._7_1_ = 1;
        bVar2 = true;
      }
      else {
        bVar2 = DataParameter::has_mean_file((DataParameter *)local_68);
        if (bVar2) {
          net_param_local._7_1_ = 1;
          bVar2 = true;
        }
        else {
          bVar2 = DataParameter::has_crop_size((DataParameter *)local_68);
          if (bVar2) {
            net_param_local._7_1_ = 1;
            bVar2 = true;
          }
          else {
            bVar2 = DataParameter::has_mirror((DataParameter *)local_68);
            if (bVar2) {
              net_param_local._7_1_ = 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
        }
      }
      DataParameter::~DataParameter((DataParameter *)local_68);
      if (bVar2) goto LAB_007e9d71;
    }
    pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
    VVar4 = V1LayerParameter::type(pVVar5);
    if (VVar4 == V1LayerParameter_LayerType_IMAGE_DATA) {
      pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
      from_00 = V1LayerParameter::image_data_param(pVVar5);
      ImageDataParameter::ImageDataParameter
                ((ImageDataParameter *)&layer_param_2.bg_threshold_,from_00);
      bVar2 = ImageDataParameter::has_scale((ImageDataParameter *)&layer_param_2.bg_threshold_);
      if (bVar2) {
        net_param_local._7_1_ = 1;
        bVar2 = true;
      }
      else {
        bVar2 = ImageDataParameter::has_mean_file
                          ((ImageDataParameter *)&layer_param_2.bg_threshold_);
        if (bVar2) {
          net_param_local._7_1_ = 1;
          bVar2 = true;
        }
        else {
          bVar2 = ImageDataParameter::has_crop_size
                            ((ImageDataParameter *)&layer_param_2.bg_threshold_);
          if (bVar2) {
            net_param_local._7_1_ = 1;
            bVar2 = true;
          }
          else {
            bVar2 = ImageDataParameter::has_mirror
                              ((ImageDataParameter *)&layer_param_2.bg_threshold_);
            if (bVar2) {
              net_param_local._7_1_ = 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
        }
      }
      ImageDataParameter::~ImageDataParameter((ImageDataParameter *)&layer_param_2.bg_threshold_);
      if (bVar2) goto LAB_007e9d71;
    }
    pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
    VVar4 = V1LayerParameter::type(pVVar5);
    if (VVar4 == V1LayerParameter_LayerType_WINDOW_DATA) {
      pVVar5 = NetParameter::layers(net_param,layer_param._68_4_);
      from_01 = V1LayerParameter::window_data_param(pVVar5);
      WindowDataParameter::WindowDataParameter((WindowDataParameter *)local_120,from_01);
      bVar2 = WindowDataParameter::has_scale((WindowDataParameter *)local_120);
      if (bVar2) {
        net_param_local._7_1_ = 1;
        bVar2 = true;
      }
      else {
        bVar2 = WindowDataParameter::has_mean_file((WindowDataParameter *)local_120);
        if (bVar2) {
          net_param_local._7_1_ = 1;
          bVar2 = true;
        }
        else {
          bVar2 = WindowDataParameter::has_crop_size((WindowDataParameter *)local_120);
          if (bVar2) {
            net_param_local._7_1_ = 1;
            bVar2 = true;
          }
          else {
            bVar2 = WindowDataParameter::has_mirror((WindowDataParameter *)local_120);
            if (bVar2) {
              net_param_local._7_1_ = 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
          }
        }
      }
      WindowDataParameter::~WindowDataParameter((WindowDataParameter *)local_120);
      if (bVar2) goto LAB_007e9d71;
    }
  }
  net_param_local._7_1_ = 0;
LAB_007e9d71:
  return (bool)(net_param_local._7_1_ & 1);
}

Assistant:

bool NetNeedsDataUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layers_size(); ++i) {
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_DATA) {
      DataParameter layer_param = net_param.layers(i).data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_IMAGE_DATA) {
      ImageDataParameter layer_param = net_param.layers(i).image_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
    if (net_param.layers(i).type() == V1LayerParameter_LayerType_WINDOW_DATA) {
      WindowDataParameter layer_param = net_param.layers(i).window_data_param();
      if (layer_param.has_scale()) { return true; }
      if (layer_param.has_mean_file()) { return true; }
      if (layer_param.has_crop_size()) { return true; }
      if (layer_param.has_mirror()) { return true; }
    }
  }
  return false;
}